

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O0

void __thiscall Imf_3_3::OpaqueAttribute::copyValueFrom(OpaqueAttribute *this,Attribute *other)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__src;
  long *in_RSI;
  long in_RDI;
  stringstream _iex_throw_s;
  OpaqueAttribute *oa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  long in_stack_fffffffffffffe08;
  Array<char> *in_stack_fffffffffffffe10;
  long local_1c8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (long *)0x0) {
    local_1c8 = 0;
  }
  else {
    local_1c8 = __dynamic_cast(in_RSI,&Attribute::typeinfo,&typeinfo,0);
  }
  local_18 = local_1c8;
  if (local_1c8 != 0) {
    bVar1 = std::operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (!bVar1) {
      Array<char>::resizeErase(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(local_18 + 0x28);
      pcVar4 = Array::operator_cast_to_char_((Array *)(in_RDI + 0x30));
      __src = Array::operator_cast_to_char_((Array *)(local_18 + 0x30));
      memcpy(pcVar4,__src,*(size_t *)(local_18 + 0x28));
      return;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Cannot copy the value of an image file attribute of type \"");
  pcVar4 = (char *)(**(code **)(*local_10 + 0x10))();
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\" to an attribute of type \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
  std::operator<<(poVar2,"\".");
  uVar3 = __cxa_allocate_exception(0x48);
  Iex_3_3::TypeExc::TypeExc
            ((TypeExc *)in_stack_fffffffffffffe00,(stringstream *)in_stack_fffffffffffffdf8);
  __cxa_throw(uVar3,&Iex_3_3::TypeExc::typeinfo,Iex_3_3::TypeExc::~TypeExc);
}

Assistant:

void
OpaqueAttribute::copyValueFrom (const Attribute& other)
{
    const OpaqueAttribute* oa = dynamic_cast<const OpaqueAttribute*> (&other);

    if (oa == 0 || _typeName != oa->_typeName)
    {
        THROW (
            IEX_NAMESPACE::TypeExc,
            "Cannot copy the value of an "
            "image file attribute of type "
            "\"" << other.typeName ()
                 << "\" "
                    "to an attribute of type "
                    "\""
                 << _typeName << "\".");
    }

    _data.resizeErase (oa->_dataSize);
    _dataSize = oa->_dataSize;
    memcpy ((char*) _data, (const char*) oa->_data, oa->_dataSize);
}